

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearScan.cpp
# Opt level: O3

void __thiscall LinearScan::KillImplicitRegs(LinearScan *this,Instr *instr)

{
  BitVector *pBVar1;
  code *pcVar2;
  RegNum RVar3;
  bool bVar4;
  BVIndex BVar5;
  undefined4 *puVar6;
  Loop *pLVar7;
  ulong uVar8;
  ulong uVar9;
  
  if ((instr->m_kind < 6) && ((0x2cU >> (instr->m_kind & 0x1f) & 1) != 0)) {
    (this->tempRegs).word = 0;
  }
  if (instr->m_opcode != Yield) {
    if (instr->m_opcode == IMUL) {
      RVar3 = LowererMDArch::GetRegIMulHighDestLower();
      SpillReg(this,RVar3,false);
      RVar3 = LowererMDArch::GetRegIMulHighDestLower();
      BVUnitT<unsigned_long>::AssertRange((uint)RVar3);
      (this->tempRegs).word =
           (this->tempRegs).word &
           (-2L << (RVar3 & (RegXMM15|RegXMM14)) |
           0xfffffffffffffffeU >> 0x40 - (RVar3 & (RegXMM15|RegXMM14)));
      RVar3 = LowererMDArch::GetRegIMulHighDestLower();
      RecordLoopUse(this,(Lifetime *)0x0,RVar3);
      return;
    }
    TrackInlineeArgLifetimes(this,instr);
    bVar4 = LowererMD::IsCall(instr);
    if ((!bVar4) && ((instr->field_0x38 & 0x10) != 0)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar6 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                         ,0xd1f,"(LowererMD::IsCall(instr) || !instr->HasBailOutInfo())",
                         "LowererMD::IsCall(instr) || !instr->HasBailOutInfo()");
      if (!bVar4) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar6 = 0;
    }
    bVar4 = LowererMD::IsCall(instr);
    if ((bVar4) &&
       (((instr->field_0x38 & 0x10) == 0 || (bVar4 = IR::Instr::HasLazyBailOut(instr), bVar4)))) {
      if ((this->currentBlock->inlineeStack).
          super_ReadOnlyList<Func_*,_Memory::JitArenaAllocator,_DefaultComparer>.count < 1) {
        instr->m_func = this->func;
      }
      else {
        SpillInlineeArgs(this,instr);
      }
      uVar9 = (this->callerSavedRegs).word & (this->activeRegs).word;
      if (uVar9 != 0) {
        uVar8 = 0;
        if (uVar9 != 0) {
          for (; (uVar9 >> uVar8 & 1) == 0; uVar8 = uVar8 + 1) {
          }
        }
        do {
          BVUnitT<unsigned_long>::AssertRange((BVIndex)uVar8);
          uVar9 = uVar9 & ~(1L << (uVar8 & 0x3f));
          SpillReg(this,(RegNum)uVar8,false);
          uVar8 = 0;
          if (uVar9 != 0) {
            for (; (uVar9 >> uVar8 & 1) == 0; uVar8 = uVar8 + 1) {
            }
          }
        } while (uVar9 != 0);
      }
      (this->tempRegs).word = (this->tempRegs).word & (this->calleeSavedRegs).word;
      BVar5 = BVUnitT<unsigned_long>::CountBit((this->callSetupRegs).word);
      if (BVar5 != 0) {
        (this->callSetupRegs).word = 0;
      }
      for (pLVar7 = this->curLoop; pLVar7 != (Loop *)0x0; pLVar7 = pLVar7->parent) {
        pBVar1 = &(pLVar7->regAlloc).regUseBv;
        pBVar1->word = pBVar1->word | (this->callerSavedRegs).word;
      }
    }
    return;
  }
  GeneratorBailIn::SpillRegsForBailIn(&this->bailIn);
  return;
}

Assistant:

void
LinearScan::KillImplicitRegs(IR::Instr *instr)
{
    if (instr->IsLabelInstr() || instr->IsBranchInstr())
    {
        // Note: need to clear these for branch as well because this info isn't recorded for second chance
        //       allocation on branch boundaries
        this->tempRegs.ClearAll();
    }

#if defined(_M_IX86) || defined(_M_X64)
    if (instr->m_opcode == Js::OpCode::IMUL)
    {
        this->SpillReg(LowererMDArch::GetRegIMulHighDestLower());
        this->tempRegs.Clear(LowererMDArch::GetRegIMulHighDestLower());

        this->RecordLoopUse(nullptr, LowererMDArch::GetRegIMulHighDestLower());
        return;
    }

    if (instr->m_opcode == Js::OpCode::Yield)
    {
        this->bailIn.SpillRegsForBailIn();
        return;
    }
#endif

    this->TrackInlineeArgLifetimes(instr);

    // Don't care about kills on bailout calls (e.g: call SaveAllRegAndBailOut) as we are going to exit anyways.
    // Note that those are different from normal helper calls with LazyBailOut because they are not guaranteed to exit.
    // Also, for bailout scenarios we have already handled the inlinee frame spills.
    // 
    // Lazy bailout:
    // Also make sure that Call instructions that previously do not have bailouts are still processed the same way in RegAlloc
    // Previously only `call SaveAllRegistersAndBailOut` can have bailout, but now other calls may have lazy bailouts too.
    // This makes them not being processed the same way as before(such as computing Lifetime across calls).
    Assert(LowererMD::IsCall(instr) || !instr->HasBailOutInfo());
    if (!LowererMD::IsCall(instr) || (instr->HasBailOutInfo() && !instr->HasLazyBailOut()))
    {
        return;
    }

    if (this->currentBlock->inlineeStack.Count() > 0)
    {
        this->SpillInlineeArgs(instr);
    }
    else
    {
        instr->m_func = this->func;
    }

    //
    // Spill caller-saved registers that are active.
    //
    BitVector deadRegs;
    deadRegs.Copy(this->activeRegs);
    deadRegs.And(this->callerSavedRegs);
    FOREACH_BITSET_IN_UNITBV(reg, deadRegs, BitVector)
    {
        this->SpillReg((RegNum)reg);
    }
    NEXT_BITSET_IN_UNITBV;
    this->tempRegs.And(this->calleeSavedRegs);

    if (callSetupRegs.Count())
    {
        callSetupRegs.ClearAll();
    }
    Loop *loop = this->curLoop;
    while (loop)
    {
        loop->regAlloc.regUseBv.Or(this->callerSavedRegs);
        loop = loop->parent;
    }
}